

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void makestartposgood(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (uint)CmdLine[1];
  uVar2 = (uVar1 - ConCols) + 2;
  uVar3 = (uint)CmdLine[0x103];
  if (CmdLine[0] <= CmdLine[0x103]) {
    uVar3 = uVar2;
  }
  if (ConCols + -2 <= (int)(uVar1 - CmdLine[0x103])) {
    uVar3 = uVar2;
  }
  if (CmdLine[1] < CmdLine[0x103]) {
    uVar3 = uVar1;
  }
  CmdLine[0x103] = '\0';
  if (0 < (int)uVar3) {
    CmdLine[0x103] = (BYTE)uVar3;
  }
  return;
}

Assistant:

static void makestartposgood ()
{
	int n;
	int pos = CmdLine[259];
	int curs = CmdLine[1];
	int len = CmdLine[0];

	n = pos;

	if (pos >= len)
	{ // Start of visible line is beyond end of line
		n = curs - ConCols + 2;
	}
	if ((curs - pos) >= ConCols - 2)
	{ // The cursor is beyond the visible part of the line
		n = curs - ConCols + 2;
	}
	if (pos > curs)
	{ // The cursor is in front of the visible part of the line
		n = curs;
	}
	if (n < 0)
		n = 0;
	CmdLine[259] = n;
}